

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O1

int yaml_string_extend(yaml_char_t **start,yaml_char_t **pointer,yaml_char_t **end)

{
  yaml_char_t *pyVar1;
  yaml_char_t *pyVar2;
  size_t __n;
  
  pyVar2 = (yaml_char_t *)yaml_realloc(*start,((long)*end - (long)*start) * 2);
  if (pyVar2 != (yaml_char_t *)0x0) {
    pyVar1 = *start;
    __n = (long)*end - (long)pyVar1;
    memset(pyVar2 + __n,0,__n);
    *pointer = pyVar2 + ((long)*pointer - (long)pyVar1);
    *end = pyVar2 + ((long)*end - (long)*start) * 2;
    *start = pyVar2;
  }
  return (uint)(pyVar2 != (yaml_char_t *)0x0);
}

Assistant:

YAML_DECLARE(int)
yaml_string_extend(yaml_char_t **start,
        yaml_char_t **pointer, yaml_char_t **end)
{
    yaml_char_t *new_start = (yaml_char_t *)yaml_realloc((void*)*start, (*end - *start)*2);

    if (!new_start) return 0;

    memset(new_start + (*end - *start), 0, *end - *start);

    *pointer = new_start + (*pointer - *start);
    *end = new_start + (*end - *start)*2;
    *start = new_start;

    return 1;
}